

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_v4addr_is_local_(in_addr *in)

{
  uint32_t addr_00;
  int iVar1;
  bool local_15;
  uint32_t addr;
  in_addr *in_local;
  
  addr_00 = ntohl(in->s_addr);
  local_15 = true;
  if (addr_00 != 0) {
    iVar1 = evutil_v4addr_is_localhost(addr_00);
    local_15 = true;
    if (iVar1 == 0) {
      iVar1 = evutil_v4addr_is_linklocal(addr_00);
      local_15 = true;
      if (iVar1 == 0) {
        iVar1 = evutil_v4addr_is_classd(addr_00);
        local_15 = iVar1 != 0;
      }
    }
  }
  return (int)local_15;
}

Assistant:

int
evutil_v4addr_is_local_(const struct in_addr *in)
{
	const ev_uint32_t addr = ntohl(in->s_addr);
	return addr == INADDR_ANY ||
		evutil_v4addr_is_localhost(addr) ||
		evutil_v4addr_is_linklocal(addr) ||
		evutil_v4addr_is_classd(addr);
}